

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

Mio_Cell_t * Mio_CollectRootsNew(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  Mio_Cell_t *pMVar7;
  Mio_Gate_t *pMVar8;
  void *__ptr;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  word *pwVar12;
  Mio_Cell_t *pMVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  
  iVar5 = Mio_LibraryReadGateNum(pLib);
  pMVar7 = (Mio_Cell_t *)calloc((long)(iVar5 + 4),0x30);
  pMVar8 = Mio_LibraryReadGates(pLib);
  uVar9 = 4;
  do {
    if (pMVar8 == (Mio_Gate_t *)0x0) {
      if (pMVar7->pName == (char *)0x0) {
        pcVar14 = "Error: Cannot find constant 0 gate in the library.";
      }
      else if (pMVar7[1].pName == (char *)0x0) {
        pcVar14 = "Error: Cannot find constant 1 gate in the library.";
      }
      else if (pMVar7[2].pName == (char *)0x0) {
        pcVar14 = "Error: Cannot find buffer gate in the library.";
      }
      else {
        if (pMVar7[3].pName != (char *)0x0) {
          if (5 < (int)uVar9) {
            qsort(pMVar7 + 4,(ulong)(uVar9 - 4),0x30,Mio_AreaCompare);
            iVar6 = Mio_AreaCompare(pMVar7 + 4,pMVar7 + ((ulong)uVar9 - 1));
            if (0 < iVar6) {
              __assert_fail("Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                            ,0x241,
                            "Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
            }
          }
          uVar10 = 0;
          uVar15 = 0;
          if (0 < (int)uVar9) {
            uVar15 = (ulong)uVar9;
          }
          puVar11 = (uint *)&pMVar7->field_0x8;
          for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
            uVar2 = (uint)uVar10 & 0xfffffff;
            if (*(long *)(puVar11 + -2) == 0) {
              uVar2 = 0xfffffff;
            }
            *puVar11 = *puVar11 & 0xf0000000 | uVar2;
            puVar11 = puVar11 + 0xc;
          }
          if (fVerbose != 0) {
            __ptr = calloc((long)(iVar5 + 4),4);
            pMVar8 = Mio_LibraryReadGates(pLib);
            for (; pMVar8 != (Mio_Gate_t *)0x0; pMVar8 = Mio_GateReadNext(pMVar8)) {
              if ((pMVar8->nInputs <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
                uVar10 = 0;
                pwVar12 = &pMVar7->uTruth;
                while( true ) {
                  if (uVar15 == uVar10) {
                    __assert_fail("i < iCell",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                                  ,0x256,
                                  "Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                                 );
                  }
                  if ((((Mio_Cell_t *)(pwVar12 + -2))->pName != (char *)0x0) &&
                     (*pwVar12 == (pMVar8->field_15).uTruth)) break;
                  uVar10 = uVar10 + 1;
                  pwVar12 = pwVar12 + 6;
                }
                piVar1 = (int *)((long)__ptr + uVar10 * 4);
                *piVar1 = *piVar1 + 1;
              }
            }
            pMVar13 = pMVar7;
            for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
              printf("%4d : ",uVar10 & 0xffffffff);
              pcVar14 = pMVar13->pName;
              if (pcVar14 == (char *)0x0) {
                puts("None");
              }
              else {
                uVar2 = *(uint *)&pMVar13->field_0x8;
                uVar3 = *(uint *)((long)__ptr + uVar10 * 4);
                fVar17 = pMVar13->Area;
                fVar18 = Mio_CellDelayAve(pMVar13);
                printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",(double)fVar17,
                       (double)fVar18,pcVar14,(ulong)(uVar2 >> 0x1c),(ulong)uVar3);
              }
              pMVar13 = pMVar13 + 1;
            }
            free(__ptr);
          }
          if (pnGates == (int *)0x0) {
            return pMVar7;
          }
          *pnGates = uVar9;
          return pMVar7;
        }
        pcVar14 = "Error: Cannot find inverter gate in the library.";
      }
      puts(pcVar14);
      return (Mio_Cell_t *)0x0;
    }
    iVar6 = pMVar8->nInputs;
    if ((iVar6 <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
      uVar10 = 0;
      pMVar13 = pMVar7;
      if (0 < (int)uVar9) {
        uVar10 = (ulong)uVar9;
      }
      while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
        pcVar14 = pMVar13->pName;
        if ((pcVar14 != (char *)0x0) && (pMVar13->uTruth == (pMVar8->field_15).uTruth)) {
          if ((float)pMVar8->dArea + 0.0094636 < pMVar13->Area) goto LAB_0034e0f9;
          if (pMVar13->Area < (float)pMVar8->dArea + -0.0094636) goto LAB_0034e101;
          fVar17 = Mio_CellDelayAve(pMVar13);
          fVar18 = Mio_GateDelayAve(pMVar8);
          if (fVar18 + 0.0094636 < fVar17) goto LAB_0034e0f9;
          if (fVar17 < fVar18 + -0.0094636) goto LAB_0034e101;
          iVar6 = strcmp(pcVar14,pMVar8->pName);
          if (0 < iVar6) goto LAB_0034e0f9;
          if (-1 < iVar6) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x1fe,"int Mio_CompareTwo(Mio_Cell_t *, Mio_Gate_t *)");
          }
          goto LAB_0034e101;
        }
        pMVar13 = pMVar13 + 1;
      }
      wVar4 = (pMVar8->field_15).uTruth;
      if (wVar4 + 1 < 2) {
        if (iVar6 != 0) {
          __assert_fail("pGate->nInputs == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x227,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
        }
        uVar10 = (ulong)(wVar4 == 0xffffffffffffffff);
LAB_0034e0f2:
        pMVar13 = pMVar7 + uVar10;
      }
      else {
        if ((wVar4 != 0xaaaaaaaaaaaaaaaa) && (wVar4 != 0x5555555555555555)) {
          uVar10 = (ulong)(int)uVar9;
          uVar9 = uVar9 + 1;
          goto LAB_0034e0f2;
        }
        if (iVar6 != 1) {
          __assert_fail("pGate->nInputs == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x22e,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
        }
        pMVar13 = pMVar7 + 2;
        if (wVar4 == 0x5555555555555555) {
          pMVar13 = pMVar7 + 3;
        }
      }
LAB_0034e0f9:
      Mio_CollectCopy(pMVar13,pMVar8);
    }
LAB_0034e101:
    pMVar8 = Mio_GateReadNext(pMVar8);
  } while( true );
}

Assistant:

Mio_Cell_t * Mio_CollectRootsNew( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Cell_t * ppCells;
    int i, nGates, iCell = 4;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells = ABC_CALLOC( Mio_Cell_t, nGates + 4 );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwo( ppCells + i, pGate ) )
                    Mio_CollectCopy( ppCells + i, pGate );
                break;
            }
        if ( i < iCell )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
        {
            int Idx = (int)(pGate->uTruth == ~(word)0);
            assert( pGate->nInputs == 0 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pGate->nInputs == 1 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        Mio_CollectCopy( ppCells + iCell++, pGate );
    }
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare );
        assert( Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    for ( i = 0; i < iCell; i++ )
        ppCells[i].Id = ppCells[i].pName ? i : -1;

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate )
        {
            if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->Area, Mio_CellDelayAve(pCell) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}